

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O1

_Bool float_isclose(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  double dVar1;
  gravity_fiber_t *fiber;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  gravity_float_t gVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  gravity_value_t value;
  gravity_value_t gVar9;
  char _buffer [4096];
  char local_1028 [4104];
  
  if (nargs < 2) {
    aVar2.n = 1;
  }
  else {
    dVar1 = (args->field_1).f;
    gVar9 = convert_value2float(vm,args[1]);
    if (gVar9.isa == (gravity_class_t *)0x0) {
      builtin_strncpy(local_1028,"Unable to convert object to Float",0x22);
      fiber = gravity_vm_fiber(vm);
      gravity_fiber_seterror(fiber,local_1028);
      gVar9.field_1.n = 0;
      gVar9.isa = gravity_class_null;
      gravity_vm_setslot(vm,gVar9,rindex);
      return false;
    }
    uVar3 = 0xe826d695;
    uVar4 = 0x3e112e0b;
    if ((nargs != 2) && (args[2].isa == gravity_class_float)) {
      uVar3 = (undefined4)args[2].field_1.n;
      uVar4 = (undefined4)((ulong)args[2].field_1.n >> 0x20);
    }
    gVar5 = 0.0;
    if ((3 < nargs) && (args[3].isa == gravity_class_float)) {
      gVar5 = args[3].field_1.f;
    }
    dVar8 = ABS(dVar1);
    dVar6 = ABS(gVar9.field_1.f);
    dVar7 = dVar6;
    if (dVar6 <= dVar8) {
      dVar7 = dVar8;
    }
    dVar6 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar7 | -(ulong)NAN(dVar8) & (ulong)dVar6) *
            (double)CONCAT44(uVar4,uVar3);
    dVar7 = gVar5;
    if (gVar5 <= dVar6) {
      dVar7 = dVar6;
    }
    aVar2.n._1_7_ = 0;
    aVar2.n._0_1_ =
         ABS(dVar1 - gVar9.field_1.f) <=
         (double)(-(ulong)NAN(dVar6) & (ulong)gVar5 | ~-(ulong)NAN(dVar6) & (ulong)dVar7);
  }
  value.field_1.n = aVar2.n;
  value.isa = gravity_class_bool;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool float_isclose (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_VALUE(VALUE_FROM_BOOL(true), rindex);
    
    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_FLOAT(v2, true);
    gravity_float_t rel_tol = 1e-09;
    gravity_float_t abs_tol=0.0;
    if (nargs > 2 && VALUE_ISA_FLOAT(GET_VALUE(2))) rel_tol = VALUE_AS_FLOAT(GET_VALUE(2));
    if (nargs > 3 && VALUE_ISA_FLOAT(GET_VALUE(3))) abs_tol = VALUE_AS_FLOAT(GET_VALUE(3));
    
    // abs(a-b) <= max(rel_tol * max(abs(a), abs(b)), abs_tol)
    
    #if GRAVITY_ENABLE_DOUBLE
    gravity_float_t abs_diff = fabs(v1.f - v2.f);
    gravity_float_t abs_a = fabs(v1.f);
    gravity_float_t abs_b = fabs(v2.f);
    gravity_float_t abs_max = fmax(abs_a, abs_b);
    gravity_float_t result = fmax(rel_tol * abs_max, abs_tol);
    #else
    gravity_float_t abs_diff = fabsf(v1.f - v2.f);
    gravity_float_t abs_a = fabsf(v1.f);
    gravity_float_t abs_b = fabsf(v2.f);
    gravity_float_t abs_max = fmaxf(abs_a, abs_b);
    gravity_float_t result = fmaxf(rel_tol * abs_max, abs_tol);
    #endif
    
    RETURN_VALUE(VALUE_FROM_BOOL(abs_diff <= result), rindex);
}